

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::GenericClassDefSymbol>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          GenericClassDefSymbol *t)

{
  GenericClassDefSymbol *in_stack_00000048;
  ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *in_stack_00000050;
  
  visitDefault<slang::ast::GenericClassDefSymbol>(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }